

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

bool __thiscall nite::Color::cInterp(Color *this,Color *f,float Step)

{
  bool bVar1;
  undefined1 local_34 [8];
  Color copy;
  float Step_local;
  Color *f_local;
  Color *this_local;
  
  copy.b = Step;
  unique0x100000e7 = f;
  bVar1 = operator==(this,f);
  if (!bVar1) {
    Color((Color *)local_34,stack0xffffffffffffffe0);
    to100((Color *)local_34);
    to100(this);
    nite::cInterp(&this->r,(float)local_34._0_4_,copy.b);
    nite::cInterp(&this->g,(float)local_34._4_4_,copy.b);
    nite::cInterp(&this->b,copy.r,copy.b);
    nite::cInterp(&this->a,copy.g,copy.b);
    to1(this);
    rectify(this);
  }
  return bVar1;
}

Assistant:

bool nite::Color::cInterp(const Color &f, float Step){
	if(*this == f) return true;
	auto copy = f;
	copy.to100();
	this->to100();
	nite::cInterp(r, copy.r, Step);
	nite::cInterp(g, copy.g, Step);
	nite::cInterp(b, copy.b, Step);
	nite::cInterp(a, copy.a, Step);
	this->to1();	
	rectify();
	return false;
}